

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  ostream *poVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_2a1;
  undefined1 local_2a0 [12];
  undefined1 local_290 [12];
  string local_280 [8];
  string text;
  istream_type local_258 [8];
  ifstream file;
  allocator<char> local_39;
  string local_38 [8];
  string encoding;
  char **argv_local;
  int argc_local;
  
  encoding.field_2._8_8_ = argv;
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: testEncoding <encoding> <file>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::ifstream::ifstream(local_258,*(undefined8 *)(encoding.field_2._8_8_ + 0x10),8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to open file: ");
      poVar2 = std::operator<<(poVar2,*(char **)(encoding.field_2._8_8_ + 0x10));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 2;
      text.field_2._12_4_ = 1;
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_290,local_258);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2a0);
      std::allocator<char>::allocator();
      __beg._12_4_ = 0;
      __beg._M_sbuf = (streambuf_type *)local_290._0_8_;
      __beg._M_c = local_290._8_4_;
      __end._12_4_ = 0;
      __end._M_sbuf = (streambuf_type *)local_2a0._0_8_;
      __end._M_c = local_2a0._8_4_;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (local_280,__beg,__end,&local_2a1);
      std::allocator<char>::~allocator(&local_2a1);
      std::operator<<((ostream *)&std::cout,local_280);
      argv_local._4_4_ = 0;
      text.field_2._12_4_ = 1;
      std::__cxx11::string::~string(local_280);
    }
    std::ifstream::~ifstream(local_258);
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
#ifdef _WIN32
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
#endif
  if (argc <= 2) {
    std::cout << "Usage: testEncoding <encoding> <file>" << std::endl;
    return 1;
  }
  const std::string encoding(argv[1]);
#ifdef _WIN32
  if ((encoding == "UTF8") || (encoding == "UTF-8")) {
    setEncoding(consoleOut, CP_UTF8);
  } else if (encoding == "ANSI") {
    setEncoding(consoleOut, CP_ACP);
  } else if (encoding == "OEM") {
    setEncoding(consoleOut, CP_OEMCP);
  } // else AUTO
#endif
  cmsys::ifstream file(argv[2]);
  if (!file.is_open()) {
    std::cout << "Failed to open file: " << argv[2] << std::endl;
    return 2;
  }
  std::string text((std::istreambuf_iterator<char>(file)),
                   std::istreambuf_iterator<char>());
  std::cout << text;
  return 0;
}